

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O3

bool __thiscall
Simple::Lib::
ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
::disconnect(ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
             *this,size_t connection)

{
  SignalLink *pSVar1;
  SignalLink *this_00;
  
  pSVar1 = this->callback_ring_;
  if (pSVar1 == (SignalLink *)0x0) {
    return false;
  }
  this_00 = pSVar1->next;
  if (this_00 != pSVar1 && this_00 != (SignalLink *)0x0) {
    do {
      if (this_00 == (SignalLink *)connection) {
        SignalLink::unlink(this_00,(char *)connection);
        return true;
      }
      this_00 = this_00->next;
    } while (this_00 != pSVar1);
  }
  return false;
}

Assistant:

bool disconnect (size_t connection)
  {
      return callback_ring_ ? callback_ring_->remove_sibling (connection) : false;
  }